

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O3

void AM_changeWindowLoc(void)

{
  undefined4 uVar1;
  undefined4 uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double local_28;
  double local_20;
  DAngle local_18;
  
  if ((((_ZL8m_paninc_0 != 0.0) || (NAN(_ZL8m_paninc_0))) || (_ZL8m_paninc_1 != 0.0)) ||
     (NAN(_ZL8m_paninc_1))) {
    FBaseCVar::SetGenericRep(&am_followplayer.super_FBaseCVar,(UCVarValue)0x0,CVAR_Bool);
    _ZL8f_oldloc_0 = 0x47efffffe0000000;
  }
  dVar4 = m_y;
  dVar3 = m_x;
  uVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
  uVar2 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
  auVar9._0_8_ = (double)(int)uVar1 * _ZL8m_paninc_0;
  auVar9._8_8_ = (double)(int)uVar2 * _ZL8m_paninc_1;
  auVar10 = divpd(auVar9,_DAT_005e6b70);
  dVar8 = auVar10._0_8_;
  dVar11 = auVar10._8_8_;
  local_28 = dVar11;
  local_20 = dVar8;
  if (am_rotate.Value == 1) {
LAB_00346c20:
    local_18.Degrees = *(double *)((&DAT_017e1fb8)[(long)consoleplayer * 0x54] + 0xb0) + -90.0;
    AM_rotate(&local_20,&local_28,&local_18);
    auVar10._8_8_ = local_28;
    auVar10._0_8_ = local_20;
LAB_00346cc3:
    m_x = auVar10._0_8_ + m_x;
    m_y = auVar10._8_8_ + m_y;
    dVar5 = m_h * 0.5;
    dVar6 = m_w * 0.5;
    if (am_rotate.Value != 0) {
      if (am_rotate.Value != 2) goto LAB_00346dff;
      goto LAB_00346d6f;
    }
  }
  else {
    if (am_rotate.Value != 2) goto LAB_00346cc3;
    if (viewactive != false) goto LAB_00346c20;
    m_x = dVar8 + m_x;
    m_y = dVar11 + m_y;
    dVar5 = m_h * 0.5;
    dVar6 = m_w * 0.5;
LAB_00346d6f:
    if (viewactive != false) goto LAB_00346dff;
  }
  dVar7 = max_x;
  if ((max_x < m_x + dVar6) || (dVar7 = min_x, m_x + dVar6 < min_x)) {
    m_x = dVar7 - dVar6;
  }
  dVar6 = max_y;
  if ((max_y < m_y + dVar5) || (dVar6 = min_y, m_y + dVar5 < min_y)) {
    m_y = dVar6 - dVar5;
  }
LAB_00346dff:
  m_x2 = m_w + m_x;
  m_y2 = m_h + m_y;
  AM_ScrollParchment((double)(-(ulong)(dVar3 != m_x) & (ulong)dVar8),
                     (double)(-(ulong)(m_y != dVar4) & (ulong)-dVar11));
  return;
}

Assistant:

void AM_changeWindowLoc ()
{
	if (m_paninc.x || m_paninc.y)
	{
		am_followplayer = false;
		f_oldloc.x = FLT_MAX;
	}

	double oldmx = m_x, oldmy = m_y;
	double incx, incy, oincx, oincy;
	
	incx = m_paninc.x;
	incy = m_paninc.y;

	oincx = incx = m_paninc.x * SCREENWIDTH / 320;
	oincy = incy = m_paninc.y * SCREENHEIGHT / 200;
	if (am_rotate == 1 || (am_rotate == 2 && viewactive))
	{
		AM_rotate(&incx, &incy, players[consoleplayer].camera->Angles.Yaw - 90.);
	}

	m_x += incx;
	m_y += incy;

	AM_ClipRotatedExtents (oldmx + m_w/2, oldmy + m_h/2);
	AM_ScrollParchment (m_x != oldmx ? oincx : 0, m_y != oldmy ? -oincy : 0);
}